

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchy.hpp
# Opt level: O2

void __thiscall
trex::
hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
register_type<Circle>
          (hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,t_type_info<Circle> *ti)

{
  pointer ptVar1;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __y;
  bool bVar2;
  long lVar3;
  type_info *ptVar4;
  pointer ptVar5;
  byte bVar6;
  type_info local_78;
  
  bVar6 = 0;
  local_78.super_type_info.destroy = (ti->super_type_info).destroy;
  local_78.super_type_info.name._M_len = (ti->super_type_info).name._M_len;
  local_78.super_type_info.name._M_str = (ti->super_type_info).name._M_str;
  local_78.super_type_info.size = (ti->super_type_info).size;
  local_78.super_type_info.alignment = (ti->super_type_info).alignment;
  local_78.super_type_info.default_construct_at = (ti->super_type_info).default_construct_at;
  local_78.super_type_info.alloc_and_construct = (ti->super_type_info).alloc_and_construct;
  local_78.as_base = as_base<Circle>;
  local_78.construct_at_a = construct_at_a<Circle>;
  local_78.alloc_and_construct_a = alloc_and_construct_a<Circle>;
  ptVar5 = (this->m_registered_types).
           super__Vector_base<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info,_std::allocator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ptVar1 = (this->m_registered_types).
           super__Vector_base<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info,_std::allocator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (ptVar5 == ptVar1) {
      std::
      vector<trex::hierarchy<Shape,std::__cxx11::string>::type_info,std::allocator<trex::hierarchy<Shape,std::__cxx11::string>::type_info>>
      ::emplace_back<trex::hierarchy<Shape,std::__cxx11::string>::type_info>
                ((vector<trex::hierarchy<Shape,std::__cxx11::string>::type_info,std::allocator<trex::hierarchy<Shape,std::__cxx11::string>::type_info>>
                  *)&this->m_registered_types,&local_78);
      return;
    }
    __x._M_len = (ptVar5->super_type_info).name._M_len;
    __x._M_str = (ptVar5->super_type_info).name._M_str;
    __y._M_len = (ti->super_type_info).name._M_len;
    __y._M_str = (ti->super_type_info).name._M_str;
    bVar2 = std::operator==(__x,__y);
    if (bVar2) break;
    ptVar5 = ptVar5 + 1;
  }
  ptVar4 = &local_78;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    (ptVar5->super_type_info).name._M_len = *(size_t *)ptVar4;
    ptVar4 = (type_info *)((long)ptVar4 + ((ulong)bVar6 * -2 + 1) * 8);
    ptVar5 = (pointer)((long)ptVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  return;
}

Assistant:

void register_type(const t_type_info<T>& ti)
    {
        static_assert(std::is_base_of<Base, T>::value, "Not a base class");

        priv::lock_guard l(m_register_mutex);

        type_info new_type_info;
        static_cast<trex::type_info&>(new_type_info) = ti;
        new_type_info.as_base = as_base<T>;
        new_type_info.construct_at_a = construct_at_a<T>;
        new_type_info.alloc_and_construct_a = alloc_and_construct_a<T>;

        // here we don't simply add the to the list
        // to support plugins and hot reloading, we override existing types
        for (auto& t : m_registered_types)
        {
            if (t.name == ti.name)
            {
                t = std::move(new_type_info);
                return;
            }
        }

        // type was not found, so add
        m_registered_types.emplace_back(std::move(new_type_info));
    }